

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

void __thiscall
CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test::TestBody
          (CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test *this)

{
  uint32_t vout;
  pointer pTVar1;
  bool bVar2;
  pointer utxo;
  _func_int **pp_Var3;
  pointer hex;
  Amount AVar4;
  bool use_bnb;
  string local_178;
  Txid txid;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelection coin_select;
  Amount local_e8;
  Amount local_d8;
  Amount local_c8;
  Amount fee_value;
  Amount select_value;
  CoinSelectionOption option_params;
  
  cfd::CoinSelection::CoinSelection(&coin_select,true);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(5);
  local_c8.amount_ = AVar4.amount_;
  local_c8.ignore_check_ = AVar4.ignore_check_;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee_value);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_d8.amount_ = AVar4.amount_;
  local_d8.ignore_check_ = AVar4.ignore_check_;
  use_bnb = false;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectTestVector.
                           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)kExtCoinSelectTestVector.
                           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  pTVar1 = kExtCoinSelectTestVector.
           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (kExtCoinSelectTestVector.
      super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      kExtCoinSelectTestVector.
      super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
           super__Vector_impl_data._M_start;
    hex = kExtCoinSelectTestVector.
          super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid(&txid);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)&local_178,&hex->txid);
        cfd::core::Txid::operator=(&txid,(Txid *)&local_178);
        local_178._M_dataplus._M_p = (pointer)&PTR__Txid_00735400;
        if ((void *)local_178._M_string_length != (void *)0x0) {
          operator_delete((void *)local_178._M_string_length);
        }
      }
      vout = hex->vout;
      AVar4 = cfd::core::Amount::CreateBySatoshiAmount(10);
      local_e8.amount_ = AVar4.amount_;
      local_e8.ignore_check_ = AVar4.ignore_check_;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
      cfd::CoinSelection::ConvertToUtxo
                (&txid,vout,&hex->descriptor,&local_e8,&local_178,(void *)0x0,utxo,(Script *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      txid._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(txid.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      utxo = utxo + 1;
      hex = hex + 1;
    } while (hex != pTVar1);
  }
  cfd::CoinSelectionOption::InitializeTxSizeInfo(&option_params);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,1.0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::CoinSelection::SelectCoins
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&coin_select,&local_c8,&utxos,
               &exp_filter,&option_params,&local_d8,&select_value,&fee_value,&use_bnb);
    pp_Var3 = txid._vptr_Txid;
  }
  else {
    pp_Var3 = (_func_int **)0x0;
  }
  testing::Message::Message((Message *)&txid);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_178,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
             ,0x275,
             "Expected: (select_utxos = coin_select.SelectCoins(target_value, utxos, exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&txid);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
  if (txid._vptr_Txid != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (txid._vptr_Txid != (_func_int **)0x0)) {
      (**(code **)(*txid._vptr_Txid + 8))();
    }
    txid._vptr_Txid = (_func_int **)0x0;
  }
  if (pp_Var3 != (_func_int **)0x0) {
    operator_delete(pp_Var3);
  }
  option_params.fee_asset_._vptr_ConfidentialAssetId =
       (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (option_params.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(option_params.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero)
{
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(5);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(10), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);

  EXPECT_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)), CfdException);
}